

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O2

Key_Func __thiscall
Fl_Text_Editor::bound_key_function(Fl_Text_Editor *this,int key,int state,Key_Binding *list)

{
  while( true ) {
    if (list == (Key_Binding *)0x0) {
      return (Key_Func)0x0;
    }
    if ((list->key == key) && ((list->state == -1 || (list->state == state)))) break;
    list = list->next;
  }
  return list->function;
}

Assistant:

Fl_Text_Editor::Key_Func Fl_Text_Editor::bound_key_function(int key, int state, Key_Binding* list) const
#endif
{
  Key_Binding* cur;
  for (cur = list; cur; cur = cur->next)
    if (cur->key == key)
      if (cur->state == FL_TEXT_EDITOR_ANY_STATE || cur->state == state)
        break;
  if (!cur) return 0;
  return cur->function;
}